

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

format_decimal_result<char_*>
fmt::v9::detail::format_decimal<char,unsigned_int>(char *out,uint value,int size)

{
  format_decimal_result<char_*> fVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  int in_EDX;
  uint32_t in_ESI;
  long in_RDI;
  char *end;
  int in_stack_ffffffffffffff9c;
  char *in_stack_ffffffffffffffa0;
  uint local_3c;
  char *local_38;
  char *local_30;
  
  iVar2 = count_digits(in_ESI);
  if (iVar2 <= in_EDX) {
    local_38 = (char *)(in_RDI + in_EDX);
    for (local_3c = in_ESI; 99 < local_3c; local_3c = local_3c / 100) {
      local_38 = local_38 + -2;
      pcVar3 = digits2((ulong)local_3c % 100);
      *(undefined2 *)local_38 = *(undefined2 *)pcVar3;
    }
    if (local_3c < 10) {
      local_30 = local_38 + -1;
      local_38[-1] = (char)local_3c + '0';
    }
    else {
      local_30 = local_38 + -2;
      pcVar3 = local_30;
      pcVar4 = digits2((ulong)local_3c);
      *(undefined2 *)pcVar3 = *(undefined2 *)pcVar4;
    }
    fVar1.end = (char *)(in_RDI + in_EDX);
    fVar1.begin = local_30;
    return fVar1;
  }
  assert_fail(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,(char *)0x1cb196);
}

Assistant:

FMT_CONSTEXPR20 auto format_decimal(Char* out, UInt value, int size)
    -> format_decimal_result<Char*> {
  FMT_ASSERT(size >= count_digits(value), "invalid digit count");
  out += size;
  Char* end = out;
  while (value >= 100) {
    // Integer division is slow so do it for a group of two digits instead
    // of for every digit. The idea comes from the talk by Alexandrescu
    // "Three Optimization Tips for C++". See speed-test for a comparison.
    out -= 2;
    copy2(out, digits2(static_cast<size_t>(value % 100)));
    value /= 100;
  }
  if (value < 10) {
    *--out = static_cast<Char>('0' + value);
    return {out, end};
  }
  out -= 2;
  copy2(out, digits2(static_cast<size_t>(value)));
  return {out, end};
}